

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_mips.cpp
# Opt level: O0

void __thiscall MipsGenerator::TranslateJUMP(MipsGenerator *this,Pcode *item)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  allocator local_69;
  string local_68;
  undefined1 local_38 [8];
  string num1;
  Pcode *item_local;
  MipsGenerator *this_local;
  
  num1.field_2._8_8_ = item;
  Pcode::GetNum1_abi_cxx11_((string *)local_38,item);
  bVar1 = std::operator==((string *)local_38,"RA");
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_68,"jr $ra",&local_69);
    Output2File(this,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
  }
  else {
    std::operator+(&local_90,"j ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
    Output2File(this,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void MipsGenerator::TranslateJUMP(Pcode& item) {
    string num1 = item.GetNum1();
    if (num1 == "RA") {
        Output2File("jr $ra");
    } else {
        Output2File("j " + num1);
    }
}